

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v128_intrinsics_c.h
# Opt level: O3

c_v128 c_v128_shr_u32(c_v128 a,uint c)

{
  byte bVar1;
  undefined8 extraout_RAX;
  undefined8 extraout_RDX;
  undefined1 auVar2 [16];
  undefined1 in_ZMM0 [64];
  c_v128 cVar3;
  c_v128 cVar4;
  
  auVar2 = in_ZMM0._0_16_;
  bVar1 = (byte)c;
  if (c < 0x20) {
    cVar3.u32[3] = a.u32[3] >> (bVar1 & 0x1f);
    cVar3.u32[2] = a.u32[2] >> (bVar1 & 0x1f);
    cVar3.u32[1] = a.u32[1] >> (bVar1 & 0x1f);
    cVar3.u32[0] = a.u32[0] >> (bVar1 & 0x1f);
    return cVar3;
  }
  c_v128_shr_u32();
  vpsrld_avx(auVar2,ZEXT416(c));
  cVar4.u64[1] = extraout_RDX;
  cVar4.u64[0] = extraout_RAX;
  return cVar4;
}

Assistant:

SIMD_INLINE c_v128 c_v128_shr_u32(c_v128 a, const unsigned int c) {
  return c_v128_from_v64(c_v64_shr_u32(a.v64[1], c),
                         c_v64_shr_u32(a.v64[0], c));
}